

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O0

void __thiscall QStackedLayout::setStackingMode(QStackedLayout *this,StackingMode stackingMode)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QStackedLayoutPrivate *pQVar6;
  qsizetype qVar7;
  undefined4 extraout_var;
  QWidget *this_00;
  const_reference ppQVar9;
  undefined4 extraout_var_00;
  StackingMode in_ESI;
  long in_FS_OFFSET;
  QWidget *widget_2;
  int i_1;
  QWidget *widget_1;
  QWidget *widget;
  int i;
  int idx;
  int n;
  QStackedLayoutPrivate *d;
  QRect geometry;
  qsizetype in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff90;
  StackingMode SVar10;
  int local_54;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar11;
  undefined4 in_stack_ffffffffffffffc8;
  long *plVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = d_func((QStackedLayout *)0x3509be);
  if (pQVar6->stackingMode != in_ESI) {
    pQVar6->stackingMode = in_ESI;
    qVar7 = QList<QLayoutItem_*>::size(&pQVar6->list);
    iVar3 = (int)qVar7;
    if (iVar3 != 0) {
      SVar10 = pQVar6->stackingMode;
      if (SVar10 == StackOne) {
        iVar5 = currentIndex((QStackedLayout *)(ulong)in_stack_ffffffffffffff90);
        if (iVar5 != 0) {
          for (iVar11 = 0; iVar11 < iVar3; iVar11 = iVar11 + 1) {
            ppQVar9 = QList<QLayoutItem_*>::at
                                ((QList<QLayoutItem_*> *)CONCAT44(SVar10,in_stack_ffffffffffffff90),
                                 in_stack_ffffffffffffff88);
            iVar4 = (*(*ppQVar9)->_vptr_QLayoutItem[0xd])();
            plVar8 = (long *)CONCAT44(extraout_var,iVar4);
            if (plVar8 != (long *)0x0) {
              (**(code **)(*plVar8 + 0x68))(plVar8,iVar11 == iVar5);
            }
          }
        }
      }
      else if (SVar10 == StackAll) {
        QRect::QRect((QRect *)CONCAT44(1,in_stack_ffffffffffffff90));
        this_00 = currentWidget((QStackedLayout *)CONCAT44(SVar10,in_stack_ffffffffffffff90));
        if (this_00 != (QWidget *)0x0) {
          QWidget::geometry(this_00);
        }
        for (local_54 = 0; local_54 < iVar3; local_54 = local_54 + 1) {
          ppQVar9 = QList<QLayoutItem_*>::at
                              ((QList<QLayoutItem_*> *)CONCAT44(SVar10,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff88);
          iVar5 = (*(*ppQVar9)->_vptr_QLayoutItem[0xd])();
          plVar8 = (long *)CONCAT44(extraout_var_00,iVar5);
          if (plVar8 != (long *)0x0) {
            bVar2 = QRect::isNull((QRect *)CONCAT44(SVar10,in_stack_ffffffffffffff90));
            if (!bVar2) {
              QWidget::setGeometry
                        ((QWidget *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),
                         (QRect *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
            }
            (**(code **)(*plVar8 + 0x68))(plVar8,1);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStackedLayout::setStackingMode(StackingMode stackingMode)
{
    Q_D(QStackedLayout);
    if (d->stackingMode == stackingMode)
        return;
    d->stackingMode = stackingMode;

    const int n = d->list.size();
    if (n == 0)
        return;

    switch (d->stackingMode) {
    case StackOne:
        if (const int idx = currentIndex())
            for (int i = 0; i < n; ++i)
                if (QWidget *widget = d->list.at(i)->widget())
                    widget->setVisible(i == idx);
        break;
    case StackAll: { // Turn overlay on: Make sure all widgets are the same size
        QRect geometry;
        if (const QWidget *widget = currentWidget())
            geometry = widget->geometry();
        for (int i = 0; i < n; ++i)
            if (QWidget *widget = d->list.at(i)->widget()) {
                if (!geometry.isNull())
                    widget->setGeometry(geometry);
                widget->setVisible(true);
            }
    }
        break;
    }
}